

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  byte bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  Geometry *pGVar29;
  float fVar70;
  undefined1 auVar40 [16];
  long lVar30;
  RayK<4> *pRVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  float fVar39;
  undefined1 auVar41 [16];
  float fVar68;
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar85;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  undefined1 local_1681;
  size_t local_1680;
  ulong local_1678;
  Geometry *local_1670;
  ulong local_1668;
  RayK<4> *local_1660;
  uint local_1654;
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  ulong local_1618;
  ulong local_1610;
  long local_1608;
  long local_1600;
  ulong *local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  long local_15b8;
  RTCFilterFunctionNArguments local_15b0;
  undefined1 local_1580 [32];
  undefined1 local_1550 [16];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  float local_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float local_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined4 local_1440;
  undefined4 uStack_143c;
  undefined4 uStack_1438;
  undefined4 uStack_1434;
  undefined4 local_1430;
  undefined4 uStack_142c;
  undefined4 uStack_1428;
  undefined4 uStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined1 local_1410 [16];
  uint local_1400;
  uint uStack_13fc;
  uint uStack_13f8;
  uint uStack_13f4;
  uint uStack_13f0;
  uint uStack_13ec;
  uint uStack_13e8;
  uint uStack_13e4;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 *local_12e0;
  char local_12d8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  uint uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  uint uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_15f8 = local_11f8;
  local_1200 = root.ptr;
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar108 = ZEXT3264(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar109 = ZEXT3264(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar110 = ZEXT3264(auVar42);
  fVar81 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar39 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar81 * 0.99999964)));
  auVar111 = ZEXT3264(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar39 * 0.99999964)));
  auVar112 = ZEXT3264(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar68 * 0.99999964)));
  auVar113 = ZEXT3264(auVar42);
  fVar81 = fVar81 * 1.0000004;
  fVar39 = fVar39 * 1.0000004;
  fVar68 = fVar68 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar34 = uVar32 ^ 0x20;
  uVar36 = uVar33 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_13c0._4_4_ = iVar1;
  local_13c0._0_4_ = iVar1;
  local_13c0._8_4_ = iVar1;
  local_13c0._12_4_ = iVar1;
  local_13c0._16_4_ = iVar1;
  local_13c0._20_4_ = iVar1;
  local_13c0._24_4_ = iVar1;
  local_13c0._28_4_ = iVar1;
  auVar101 = ZEXT3264(local_13c0);
  iVar1 = (tray->tfar).field_0.i[k];
  local_13e0._4_4_ = iVar1;
  local_13e0._0_4_ = iVar1;
  local_13e0._8_4_ = iVar1;
  local_13e0._12_4_ = iVar1;
  local_13e0._16_4_ = iVar1;
  local_13e0._20_4_ = iVar1;
  local_13e0._24_4_ = iVar1;
  local_13e0._28_4_ = iVar1;
  auVar104 = ZEXT3264(local_13e0);
  local_15c0 = uVar32 >> 2;
  local_15c8 = uVar34 >> 2;
  local_15d0 = uVar33 >> 2;
  local_15d8 = uVar36 >> 2;
  local_15e0 = uVar35 >> 2;
  local_15e8 = (uVar35 ^ 0x20) >> 2;
  local_1550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar38 = true;
  fVar69 = fVar81;
  fVar70 = fVar81;
  fVar71 = fVar81;
  fVar72 = fVar81;
  fVar73 = fVar81;
  fVar85 = fVar81;
  fVar88 = fVar39;
  fVar89 = fVar39;
  fVar90 = fVar39;
  fVar91 = fVar39;
  fVar92 = fVar39;
  fVar93 = fVar39;
  fVar94 = fVar68;
  fVar95 = fVar68;
  fVar96 = fVar68;
  fVar97 = fVar68;
  fVar98 = fVar68;
  fVar99 = fVar68;
  local_1680 = k;
  local_1660 = ray;
  local_1618 = uVar33;
  local_1610 = uVar32;
  local_13a0 = fVar68;
  fStack_139c = fVar68;
  fStack_1398 = fVar68;
  fStack_1394 = fVar68;
  fStack_1390 = fVar68;
  fStack_138c = fVar68;
  fStack_1388 = fVar68;
  fStack_1384 = fVar68;
  local_1380 = fVar39;
  fStack_137c = fVar39;
  fStack_1378 = fVar39;
  fStack_1374 = fVar39;
  fStack_1370 = fVar39;
  fStack_136c = fVar39;
  fStack_1368 = fVar39;
  fStack_1364 = fVar39;
  local_1360 = fVar81;
  fStack_135c = fVar81;
  fStack_1358 = fVar81;
  fStack_1354 = fVar81;
  fStack_1350 = fVar81;
  fStack_134c = fVar81;
  fStack_1348 = fVar81;
  fStack_1344 = fVar81;
  do {
    uVar24 = local_15f8[-1];
    local_15f8 = local_15f8 + -1;
    while ((uVar24 & 8) == 0) {
      auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar32),auVar108._0_32_);
      auVar42 = vmulps_avx512vl(auVar111._0_32_,auVar42);
      auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar33),auVar109._0_32_);
      auVar43 = vmulps_avx512vl(auVar112._0_32_,auVar43);
      auVar42 = vmaxps_avx(auVar42,auVar43);
      auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar35),auVar110._0_32_);
      auVar44 = vmulps_avx512vl(auVar113._0_32_,auVar43);
      auVar45 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar34),auVar108._0_32_);
      auVar43._4_4_ = fVar69 * auVar45._4_4_;
      auVar43._0_4_ = fVar81 * auVar45._0_4_;
      auVar43._8_4_ = fVar70 * auVar45._8_4_;
      auVar43._12_4_ = fVar71 * auVar45._12_4_;
      auVar43._16_4_ = fVar72 * auVar45._16_4_;
      auVar43._20_4_ = fVar73 * auVar45._20_4_;
      auVar43._24_4_ = fVar85 * auVar45._24_4_;
      auVar43._28_4_ = auVar45._28_4_;
      auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar36),auVar109._0_32_);
      auVar45._4_4_ = fVar88 * auVar46._4_4_;
      auVar45._0_4_ = fVar39 * auVar46._0_4_;
      auVar45._8_4_ = fVar89 * auVar46._8_4_;
      auVar45._12_4_ = fVar90 * auVar46._12_4_;
      auVar45._16_4_ = fVar91 * auVar46._16_4_;
      auVar45._20_4_ = fVar92 * auVar46._20_4_;
      auVar45._24_4_ = fVar93 * auVar46._24_4_;
      auVar45._28_4_ = auVar46._28_4_;
      auVar45 = vminps_avx(auVar43,auVar45);
      auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar35 ^ 0x20)),
                                auVar110._0_32_);
      auVar46._4_4_ = fVar94 * auVar43._4_4_;
      auVar46._0_4_ = fVar68 * auVar43._0_4_;
      auVar46._8_4_ = fVar95 * auVar43._8_4_;
      auVar46._12_4_ = fVar96 * auVar43._12_4_;
      auVar46._16_4_ = fVar97 * auVar43._16_4_;
      auVar46._20_4_ = fVar98 * auVar43._20_4_;
      auVar46._24_4_ = fVar99 * auVar43._24_4_;
      auVar46._28_4_ = auVar43._28_4_;
      auVar43 = vmaxps_avx(auVar44,auVar101._0_32_);
      auVar42 = vmaxps_avx(auVar42,auVar43);
      auVar43 = vminps_avx(auVar46,auVar104._0_32_);
      auVar43 = vminps_avx(auVar45,auVar43);
      uVar25 = vcmpps_avx512vl(auVar42,auVar43,2);
      if ((char)uVar25 == '\0') goto LAB_007be48f;
      uVar22 = uVar24 & 0xfffffffffffffff0;
      lVar23 = 0;
      for (uVar24 = uVar25; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar24 = *(ulong *)(uVar22 + lVar23 * 8);
      uVar27 = (uint)uVar25 - 1 & (uint)uVar25;
      uVar25 = (ulong)uVar27;
      if (uVar27 != 0) {
        *local_15f8 = uVar24;
        lVar23 = 0;
        for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
          lVar23 = lVar23 + 1;
        }
        uVar27 = uVar27 - 1 & uVar27;
        uVar25 = (ulong)uVar27;
        bVar37 = uVar27 == 0;
        while( true ) {
          local_15f8 = local_15f8 + 1;
          uVar24 = *(ulong *)(uVar22 + lVar23 * 8);
          if (bVar37) break;
          *local_15f8 = uVar24;
          lVar23 = 0;
          for (uVar24 = uVar25; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar25 = uVar25 - 1 & uVar25;
          bVar37 = uVar25 == 0;
        }
      }
    }
    local_1600 = (ulong)((uint)uVar24 & 0xf) - 8;
    if (local_1600 != 0) {
      uVar24 = uVar24 & 0xfffffffffffffff0;
      local_1608 = 0;
      do {
        lVar23 = local_1608 * 0x90;
        local_15b8 = uVar24 + lVar23;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = *(ulong *)(uVar24 + 0x40 + lVar23);
        auVar76._8_8_ = 0;
        auVar76._0_8_ = *(ulong *)(uVar24 + 0x48 + lVar23);
        uVar15 = vpcmpub_avx512vl(auVar74,auVar76,2);
        uVar2 = *(undefined4 *)(uVar24 + 0x70 + lVar23);
        auVar49._4_4_ = uVar2;
        auVar49._0_4_ = uVar2;
        auVar49._8_4_ = uVar2;
        auVar49._12_4_ = uVar2;
        auVar49._16_4_ = uVar2;
        auVar49._20_4_ = uVar2;
        auVar49._24_4_ = uVar2;
        auVar49._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar24 + 0x7c + lVar23);
        auVar52._4_4_ = uVar2;
        auVar52._0_4_ = uVar2;
        auVar52._8_4_ = uVar2;
        auVar52._12_4_ = uVar2;
        auVar52._16_4_ = uVar2;
        auVar52._20_4_ = uVar2;
        auVar52._24_4_ = uVar2;
        auVar52._28_4_ = uVar2;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *(ulong *)(local_15c0 + 0x40 + local_15b8);
        auVar42 = vpmovzxbd_avx2(auVar3);
        auVar42 = vcvtdq2ps_avx(auVar42);
        auVar3 = vfmadd213ps_fma(auVar42,auVar52,auVar49);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(local_15c8 + 0x40 + local_15b8);
        auVar42 = vpmovzxbd_avx2(auVar40);
        auVar42 = vcvtdq2ps_avx(auVar42);
        auVar40 = vfmadd213ps_fma(auVar42,auVar52,auVar49);
        uVar2 = *(undefined4 *)(uVar24 + 0x74 + lVar23);
        auVar50._4_4_ = uVar2;
        auVar50._0_4_ = uVar2;
        auVar50._8_4_ = uVar2;
        auVar50._12_4_ = uVar2;
        auVar50._16_4_ = uVar2;
        auVar50._20_4_ = uVar2;
        auVar50._24_4_ = uVar2;
        auVar50._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar24 + 0x80 + lVar23);
        auVar53._4_4_ = uVar2;
        auVar53._0_4_ = uVar2;
        auVar53._8_4_ = uVar2;
        auVar53._12_4_ = uVar2;
        auVar53._16_4_ = uVar2;
        auVar53._20_4_ = uVar2;
        auVar53._24_4_ = uVar2;
        auVar53._28_4_ = uVar2;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)(local_15d0 + 0x40 + local_15b8);
        auVar42 = vpmovzxbd_avx2(auVar4);
        auVar42 = vcvtdq2ps_avx(auVar42);
        auVar4 = vfmadd213ps_fma(auVar42,auVar53,auVar50);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)(local_15d8 + 0x40 + local_15b8);
        auVar42 = vpmovzxbd_avx2(auVar5);
        auVar42 = vcvtdq2ps_avx(auVar42);
        auVar5 = vfmadd213ps_fma(auVar42,auVar53,auVar50);
        uVar2 = *(undefined4 *)(uVar24 + 0x78 + lVar23);
        auVar51._4_4_ = uVar2;
        auVar51._0_4_ = uVar2;
        auVar51._8_4_ = uVar2;
        auVar51._12_4_ = uVar2;
        auVar51._16_4_ = uVar2;
        auVar51._20_4_ = uVar2;
        auVar51._24_4_ = uVar2;
        auVar51._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar24 + 0x84 + lVar23);
        auVar54._4_4_ = uVar2;
        auVar54._0_4_ = uVar2;
        auVar54._8_4_ = uVar2;
        auVar54._12_4_ = uVar2;
        auVar54._16_4_ = uVar2;
        auVar54._20_4_ = uVar2;
        auVar54._24_4_ = uVar2;
        auVar54._28_4_ = uVar2;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)(local_15e0 + 0x40 + local_15b8);
        auVar42 = vpmovzxbd_avx2(auVar6);
        auVar42 = vcvtdq2ps_avx(auVar42);
        auVar6 = vfmadd213ps_fma(auVar42,auVar54,auVar51);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)(local_15e8 + 0x40 + local_15b8);
        auVar42 = vpmovzxbd_avx2(auVar7);
        auVar42 = vcvtdq2ps_avx(auVar42);
        auVar7 = vfmadd213ps_fma(auVar42,auVar54,auVar51);
        auVar42 = vsubps_avx512vl(ZEXT1632(auVar3),auVar108._0_32_);
        auVar42 = vmulps_avx512vl(auVar111._0_32_,auVar42);
        auVar43 = vsubps_avx512vl(ZEXT1632(auVar4),auVar109._0_32_);
        auVar43 = vmulps_avx512vl(auVar112._0_32_,auVar43);
        auVar42 = vmaxps_avx(auVar42,auVar43);
        auVar43 = vsubps_avx512vl(ZEXT1632(auVar6),auVar110._0_32_);
        auVar43 = vmulps_avx512vl(auVar113._0_32_,auVar43);
        auVar45 = vsubps_avx512vl(ZEXT1632(auVar40),auVar108._0_32_);
        auVar44._4_4_ = fVar69 * auVar45._4_4_;
        auVar44._0_4_ = fVar81 * auVar45._0_4_;
        auVar44._8_4_ = fVar70 * auVar45._8_4_;
        auVar44._12_4_ = fVar71 * auVar45._12_4_;
        auVar44._16_4_ = fVar72 * auVar45._16_4_;
        auVar44._20_4_ = fVar73 * auVar45._20_4_;
        auVar44._24_4_ = fVar85 * auVar45._24_4_;
        auVar44._28_4_ = auVar45._28_4_;
        auVar45 = vsubps_avx512vl(ZEXT1632(auVar5),auVar109._0_32_);
        auVar47._4_4_ = fVar88 * auVar45._4_4_;
        auVar47._0_4_ = fVar39 * auVar45._0_4_;
        auVar47._8_4_ = fVar89 * auVar45._8_4_;
        auVar47._12_4_ = fVar90 * auVar45._12_4_;
        auVar47._16_4_ = fVar91 * auVar45._16_4_;
        auVar47._20_4_ = fVar92 * auVar45._20_4_;
        auVar47._24_4_ = fVar93 * auVar45._24_4_;
        auVar47._28_4_ = auVar45._28_4_;
        auVar45 = vminps_avx(auVar44,auVar47);
        auVar46 = vsubps_avx512vl(ZEXT1632(auVar7),auVar110._0_32_);
        auVar48._4_4_ = fVar94 * auVar46._4_4_;
        auVar48._0_4_ = fVar68 * auVar46._0_4_;
        auVar48._8_4_ = fVar95 * auVar46._8_4_;
        auVar48._12_4_ = fVar96 * auVar46._12_4_;
        auVar48._16_4_ = fVar97 * auVar46._16_4_;
        auVar48._20_4_ = fVar98 * auVar46._20_4_;
        auVar48._24_4_ = fVar99 * auVar46._24_4_;
        auVar48._28_4_ = auVar46._28_4_;
        auVar43 = vmaxps_avx(auVar43,auVar101._0_32_);
        auVar42 = vmaxps_avx(auVar42,auVar43);
        auVar43 = vminps_avx(auVar48,auVar104._0_32_);
        auVar43 = vminps_avx(auVar45,auVar43);
        uVar14 = vcmpps_avx512vl(auVar42,auVar43,2);
        if ((byte)((byte)uVar14 & (byte)uVar15) != 0) {
          local_15f0 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
          do {
            lVar23 = 0;
            for (uVar32 = local_15f0; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
            {
              lVar23 = lVar23 + 1;
            }
            uVar8 = *(ushort *)(local_15b8 + lVar23 * 8);
            uVar9 = *(ushort *)(local_15b8 + 2 + lVar23 * 8);
            pGVar29 = (context->scene->geometries).items[*(uint *)(local_15b8 + 0x88)].ptr;
            lVar10 = *(long *)&pGVar29->field_0x58;
            lVar30 = pGVar29[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)*(uint *)(local_15b8 + 4 + lVar23 * 8);
            local_1654 = uVar9 & 0x7fff;
            uVar27 = *(uint *)(lVar10 + 4 + lVar30);
            uVar33 = (ulong)uVar27;
            uVar25 = (ulong)(uVar27 * local_1654 + *(int *)(lVar10 + lVar30) + (uVar8 & 0x7fff));
            lVar23 = *(long *)&pGVar29[1].time_range.upper;
            p_Var11 = pGVar29[1].intersectionFilterN;
            auVar3 = *(undefined1 (*) [16])(lVar23 + (uVar25 + 1) * (long)p_Var11);
            auVar40 = *(undefined1 (*) [16])(lVar23 + (uVar25 + uVar33) * (long)p_Var11);
            lVar26 = uVar25 + uVar33 + 1;
            auVar4 = *(undefined1 (*) [16])(lVar23 + lVar26 * (long)p_Var11);
            uVar32 = (ulong)(-1 < (short)uVar8);
            auVar5 = *(undefined1 (*) [16])(lVar23 + (uVar25 + uVar32 + 1) * (long)p_Var11);
            lVar28 = uVar32 + lVar26;
            auVar6 = *(undefined1 (*) [16])(lVar23 + lVar28 * (long)p_Var11);
            uVar32 = 0;
            if (-1 < (short)uVar9) {
              uVar32 = uVar33;
            }
            auVar7 = *(undefined1 (*) [16])(lVar23 + (uVar25 + uVar33 + uVar32) * (long)p_Var11);
            auVar74 = *(undefined1 (*) [16])(lVar23 + (lVar26 + uVar32) * (long)p_Var11);
            auVar82._16_16_ = *(undefined1 (*) [16])(lVar23 + (uVar32 + lVar28) * (long)p_Var11);
            auVar82._0_16_ = auVar4;
            auVar12 = vunpcklps_avx(auVar3,auVar6);
            auVar76 = vunpckhps_avx(auVar3,auVar6);
            auVar77 = vunpcklps_avx(auVar5,auVar4);
            auVar5 = vunpckhps_avx(auVar5,auVar4);
            auVar80 = vunpcklps_avx(auVar76,auVar5);
            auVar41 = vunpcklps_avx(auVar12,auVar77);
            auVar5 = vunpckhps_avx(auVar12,auVar77);
            auVar12 = vunpcklps_avx(auVar40,auVar74);
            auVar76 = vunpckhps_avx(auVar40,auVar74);
            auVar77 = vunpcklps_avx(auVar4,auVar7);
            auVar7 = vunpckhps_avx(auVar4,auVar7);
            auVar76 = vunpcklps_avx(auVar76,auVar7);
            auVar13 = vunpcklps_avx(auVar12,auVar77);
            auVar7 = vunpckhps_avx(auVar12,auVar77);
            auVar58._16_16_ = auVar74;
            auVar58._0_16_ = auVar40;
            auVar56._16_16_ = auVar6;
            auVar56._0_16_ = auVar3;
            auVar42 = vunpcklps_avx(auVar56,auVar58);
            auVar55._16_16_ = auVar4;
            auVar55._0_16_ = *(undefined1 (*) [16])(lVar23 + (long)p_Var11 * uVar25);
            auVar43 = vunpcklps_avx(auVar55,auVar82);
            auVar46 = vunpcklps_avx(auVar43,auVar42);
            auVar43 = vunpckhps_avx(auVar43,auVar42);
            auVar42 = vunpckhps_avx(auVar56,auVar58);
            auVar45 = vunpckhps_avx(auVar55,auVar82);
            auVar45 = vunpcklps_avx(auVar45,auVar42);
            auVar57._16_16_ = auVar41;
            auVar57._0_16_ = auVar41;
            auVar59._16_16_ = auVar5;
            auVar59._0_16_ = auVar5;
            auVar65._16_16_ = auVar80;
            auVar65._0_16_ = auVar80;
            auVar83._16_16_ = auVar13;
            auVar83._0_16_ = auVar13;
            auVar105._16_16_ = auVar7;
            auVar105._0_16_ = auVar7;
            uVar2 = *(undefined4 *)(local_1660 + local_1680 * 4);
            auVar106._4_4_ = uVar2;
            auVar106._0_4_ = uVar2;
            auVar106._8_4_ = uVar2;
            auVar106._12_4_ = uVar2;
            auVar106._16_4_ = uVar2;
            auVar106._20_4_ = uVar2;
            auVar106._24_4_ = uVar2;
            auVar106._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_1660 + local_1680 * 4 + 0x10);
            auVar107._4_4_ = uVar2;
            auVar107._0_4_ = uVar2;
            auVar107._8_4_ = uVar2;
            auVar107._12_4_ = uVar2;
            auVar107._16_4_ = uVar2;
            auVar107._20_4_ = uVar2;
            auVar107._24_4_ = uVar2;
            auVar107._28_4_ = uVar2;
            auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1660 + local_1680 * 4 + 0x20)));
            uVar2 = *(undefined4 *)(local_1660 + local_1680 * 4 + 0x40);
            auVar79._4_4_ = uVar2;
            auVar79._0_4_ = uVar2;
            auVar79._8_4_ = uVar2;
            auVar79._12_4_ = uVar2;
            auVar79._16_4_ = uVar2;
            auVar79._20_4_ = uVar2;
            auVar79._24_4_ = uVar2;
            auVar79._28_4_ = uVar2;
            auVar102._16_16_ = auVar76;
            auVar102._0_16_ = auVar76;
            uVar2 = *(undefined4 *)(local_1660 + local_1680 * 4 + 0x50);
            auVar86._4_4_ = uVar2;
            auVar86._0_4_ = uVar2;
            auVar86._8_4_ = uVar2;
            auVar86._12_4_ = uVar2;
            auVar86._16_4_ = uVar2;
            auVar86._20_4_ = uVar2;
            auVar86._24_4_ = uVar2;
            auVar86._28_4_ = uVar2;
            fVar81 = *(float *)(local_1660 + local_1680 * 4 + 0x60);
            auVar100._4_4_ = fVar81;
            auVar100._0_4_ = fVar81;
            auVar100._8_4_ = fVar81;
            auVar100._12_4_ = fVar81;
            auVar100._16_4_ = fVar81;
            auVar100._20_4_ = fVar81;
            auVar100._24_4_ = fVar81;
            auVar100._28_4_ = fVar81;
            auVar42 = vsubps_avx(auVar46,auVar106);
            auVar43 = vsubps_avx(auVar43,auVar107);
            auVar47 = vsubps_avx512vl(auVar45,auVar44);
            auVar45 = vsubps_avx(auVar57,auVar106);
            auVar46 = vsubps_avx(auVar59,auVar107);
            auVar48 = vsubps_avx512vl(auVar65,auVar44);
            auVar49 = vsubps_avx512vl(auVar83,auVar106);
            auVar50 = vsubps_avx512vl(auVar105,auVar107);
            auVar44 = vsubps_avx512vl(auVar102,auVar44);
            auVar51 = vsubps_avx512vl(auVar49,auVar42);
            auVar52 = vsubps_avx512vl(auVar50,auVar43);
            auVar53 = vsubps_avx512vl(auVar44,auVar47);
            auVar54 = vsubps_avx512vl(auVar42,auVar45);
            auVar55 = vsubps_avx512vl(auVar43,auVar46);
            auVar56 = vsubps_avx512vl(auVar47,auVar48);
            auVar57 = vsubps_avx512vl(auVar45,auVar49);
            auVar58 = vsubps_avx512vl(auVar46,auVar50);
            auVar59 = vsubps_avx512vl(auVar48,auVar44);
            auVar60 = vaddps_avx512vl(auVar49,auVar42);
            auVar61 = vaddps_avx512vl(auVar50,auVar43);
            auVar62 = vaddps_avx512vl(auVar44,auVar47);
            auVar63 = vmulps_avx512vl(auVar61,auVar53);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar52,auVar62);
            auVar62 = vmulps_avx512vl(auVar62,auVar51);
            auVar64 = vfmsub231ps_avx512vl(auVar62,auVar53,auVar60);
            auVar62._4_4_ = auVar60._4_4_ * auVar52._4_4_;
            auVar62._0_4_ = auVar60._0_4_ * auVar52._0_4_;
            auVar62._8_4_ = auVar60._8_4_ * auVar52._8_4_;
            auVar62._12_4_ = auVar60._12_4_ * auVar52._12_4_;
            auVar62._16_4_ = auVar60._16_4_ * auVar52._16_4_;
            auVar62._20_4_ = auVar60._20_4_ * auVar52._20_4_;
            auVar62._24_4_ = auVar60._24_4_ * auVar52._24_4_;
            auVar62._28_4_ = auVar60._28_4_;
            auVar3 = vfmsub231ps_fma(auVar62,auVar51,auVar61);
            auVar84._0_4_ = auVar3._0_4_ * fVar81;
            auVar84._4_4_ = auVar3._4_4_ * fVar81;
            auVar84._8_4_ = auVar3._8_4_ * fVar81;
            auVar84._12_4_ = auVar3._12_4_ * fVar81;
            auVar84._16_4_ = fVar81 * 0.0;
            auVar84._20_4_ = fVar81 * 0.0;
            auVar84._24_4_ = fVar81 * 0.0;
            auVar84._28_4_ = 0;
            auVar60 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar64);
            auVar62 = vfmadd231ps_avx512vl(auVar60,auVar79,auVar63);
            auVar103._0_4_ = auVar42._0_4_ + auVar45._0_4_;
            auVar103._4_4_ = auVar42._4_4_ + auVar45._4_4_;
            auVar103._8_4_ = auVar42._8_4_ + auVar45._8_4_;
            auVar103._12_4_ = auVar42._12_4_ + auVar45._12_4_;
            auVar103._16_4_ = auVar42._16_4_ + auVar45._16_4_;
            auVar103._20_4_ = auVar42._20_4_ + auVar45._20_4_;
            auVar103._24_4_ = auVar42._24_4_ + auVar45._24_4_;
            auVar103._28_4_ = auVar42._28_4_ + auVar45._28_4_;
            auVar60 = vaddps_avx512vl(auVar43,auVar46);
            auVar61 = vaddps_avx512vl(auVar47,auVar48);
            auVar63 = vmulps_avx512vl(auVar60,auVar56);
            auVar64 = vfmsub231ps_avx512vl(auVar63,auVar55,auVar61);
            auVar61 = vmulps_avx512vl(auVar61,auVar54);
            auVar61 = vfmsub231ps_avx512vl(auVar61,auVar56,auVar103);
            auVar63 = vmulps_avx512vl(auVar103,auVar55);
            auVar60 = vfmsub231ps_avx512vl(auVar63,auVar54,auVar60);
            auVar63._4_4_ = auVar60._4_4_ * fVar81;
            auVar63._0_4_ = auVar60._0_4_ * fVar81;
            auVar63._8_4_ = auVar60._8_4_ * fVar81;
            auVar63._12_4_ = auVar60._12_4_ * fVar81;
            auVar63._16_4_ = auVar60._16_4_ * fVar81;
            auVar63._20_4_ = auVar60._20_4_ * fVar81;
            auVar63._24_4_ = auVar60._24_4_ * fVar81;
            auVar63._28_4_ = auVar60._28_4_;
            auVar60 = vfmadd231ps_avx512vl(auVar63,auVar86,auVar61);
            auVar63 = vfmadd231ps_avx512vl(auVar60,auVar79,auVar64);
            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar45 = vaddps_avx512vl(auVar45,auVar49);
            auVar46 = vaddps_avx512vl(auVar46,auVar50);
            auVar44 = vaddps_avx512vl(auVar48,auVar44);
            auVar48 = vmulps_avx512vl(auVar46,auVar59);
            auVar48 = vfmsub231ps_avx512vl(auVar48,auVar58,auVar44);
            auVar44 = vmulps_avx512vl(auVar44,auVar57);
            auVar44 = vfmsub231ps_avx512vl(auVar44,auVar59,auVar45);
            auVar64._4_4_ = auVar45._4_4_ * auVar58._4_4_;
            auVar64._0_4_ = auVar45._0_4_ * auVar58._0_4_;
            auVar64._8_4_ = auVar45._8_4_ * auVar58._8_4_;
            auVar64._12_4_ = auVar45._12_4_ * auVar58._12_4_;
            auVar64._16_4_ = auVar45._16_4_ * auVar58._16_4_;
            auVar64._20_4_ = auVar45._20_4_ * auVar58._20_4_;
            auVar64._24_4_ = auVar45._24_4_ * auVar58._24_4_;
            auVar64._28_4_ = auVar45._28_4_;
            auVar3 = vfmsub231ps_fma(auVar64,auVar57,auVar46);
            auVar45 = vmulps_avx512vl(ZEXT1632(auVar3),auVar100);
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar86,auVar44);
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar79,auVar48);
            auVar75._0_4_ = auVar62._0_4_ + auVar63._0_4_;
            auVar75._4_4_ = auVar62._4_4_ + auVar63._4_4_;
            auVar75._8_4_ = auVar62._8_4_ + auVar63._8_4_;
            auVar75._12_4_ = auVar62._12_4_ + auVar63._12_4_;
            auVar75._16_4_ = auVar62._16_4_ + auVar63._16_4_;
            auVar75._20_4_ = auVar62._20_4_ + auVar63._20_4_;
            auVar75._24_4_ = auVar62._24_4_ + auVar63._24_4_;
            auVar75._28_4_ = auVar62._28_4_ + auVar63._28_4_;
            local_1300 = vaddps_avx512vl(auVar45,auVar75);
            vandps_avx512vl(local_1300,auVar65);
            auVar60._8_4_ = 0x34000000;
            auVar60._0_8_ = 0x3400000034000000;
            auVar60._12_4_ = 0x34000000;
            auVar60._16_4_ = 0x34000000;
            auVar60._20_4_ = 0x34000000;
            auVar60._24_4_ = 0x34000000;
            auVar60._28_4_ = 0x34000000;
            auVar46 = vmulps_avx512vl(local_1300,auVar60);
            auVar44 = vminps_avx512vl(auVar62,auVar63);
            auVar44 = vminps_avx512vl(auVar44,auVar45);
            auVar61._8_4_ = 0x80000000;
            auVar61._0_8_ = 0x8000000080000000;
            auVar61._12_4_ = 0x80000000;
            auVar61._16_4_ = 0x80000000;
            auVar61._20_4_ = 0x80000000;
            auVar61._24_4_ = 0x80000000;
            auVar61._28_4_ = 0x80000000;
            auVar48 = vxorps_avx512vl(auVar46,auVar61);
            uVar14 = vcmpps_avx512vl(auVar44,auVar48,5);
            auVar44 = vmaxps_avx512vl(auVar62,auVar63);
            auVar45 = vmaxps_avx512vl(auVar44,auVar45);
            uVar15 = vcmpps_avx512vl(auVar45,auVar46,2);
            bVar16 = (byte)uVar14 | (byte)uVar15;
            if (bVar16 != 0) {
              auVar45 = vmulps_avx512vl(auVar55,auVar53);
              auVar46 = vmulps_avx512vl(auVar51,auVar56);
              auVar44 = vmulps_avx512vl(auVar54,auVar52);
              auVar48 = vmulps_avx512vl(auVar58,auVar56);
              auVar49 = vmulps_avx512vl(auVar54,auVar59);
              auVar50 = vmulps_avx512vl(auVar57,auVar55);
              auVar52 = vfmsub213ps_avx512vl(auVar52,auVar56,auVar45);
              auVar53 = vfmsub213ps_avx512vl(auVar53,auVar54,auVar46);
              auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar44);
              auVar60 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar48);
              auVar61 = vfmsub213ps_avx512vl(auVar57,auVar56,auVar49);
              auVar54 = vfmsub213ps_avx512vl(auVar58,auVar54,auVar50);
              vandps_avx512vl(auVar45,auVar65);
              vandps_avx512vl(auVar48,auVar65);
              uVar32 = vcmpps_avx512vl(auVar54,auVar54,1);
              vandps_avx512vl(auVar46,auVar65);
              vandps_avx512vl(auVar49,auVar65);
              uVar33 = vcmpps_avx512vl(auVar54,auVar54,1);
              vandps_avx512vl(auVar44,auVar65);
              vandps_avx512vl(auVar50,auVar65);
              uVar25 = vcmpps_avx512vl(auVar54,auVar54,1);
              bVar37 = (bool)((byte)uVar32 & 1);
              auVar66._0_4_ = (float)((uint)bVar37 * auVar52._0_4_ | (uint)!bVar37 * auVar60._0_4_);
              bVar37 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar66._4_4_ = (float)((uint)bVar37 * auVar52._4_4_ | (uint)!bVar37 * auVar60._4_4_);
              bVar37 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar66._8_4_ = (float)((uint)bVar37 * auVar52._8_4_ | (uint)!bVar37 * auVar60._8_4_);
              bVar37 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar66._12_4_ =
                   (float)((uint)bVar37 * auVar52._12_4_ | (uint)!bVar37 * auVar60._12_4_);
              bVar37 = (bool)((byte)(uVar32 >> 4) & 1);
              auVar66._16_4_ =
                   (float)((uint)bVar37 * auVar52._16_4_ | (uint)!bVar37 * auVar60._16_4_);
              bVar37 = (bool)((byte)(uVar32 >> 5) & 1);
              auVar66._20_4_ =
                   (float)((uint)bVar37 * auVar52._20_4_ | (uint)!bVar37 * auVar60._20_4_);
              bVar37 = (bool)((byte)(uVar32 >> 6) & 1);
              auVar66._24_4_ =
                   (float)((uint)bVar37 * auVar52._24_4_ | (uint)!bVar37 * auVar60._24_4_);
              bVar37 = SUB81(uVar32 >> 7,0);
              auVar66._28_4_ = (uint)bVar37 * auVar52._28_4_ | (uint)!bVar37 * auVar60._28_4_;
              bVar37 = (bool)((byte)uVar33 & 1);
              auVar67._0_4_ = (float)((uint)bVar37 * auVar53._0_4_ | (uint)!bVar37 * auVar61._0_4_);
              bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar67._4_4_ = (float)((uint)bVar37 * auVar53._4_4_ | (uint)!bVar37 * auVar61._4_4_);
              bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar67._8_4_ = (float)((uint)bVar37 * auVar53._8_4_ | (uint)!bVar37 * auVar61._8_4_);
              bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
              auVar67._12_4_ =
                   (float)((uint)bVar37 * auVar53._12_4_ | (uint)!bVar37 * auVar61._12_4_);
              bVar37 = (bool)((byte)(uVar33 >> 4) & 1);
              auVar67._16_4_ =
                   (float)((uint)bVar37 * auVar53._16_4_ | (uint)!bVar37 * auVar61._16_4_);
              bVar37 = (bool)((byte)(uVar33 >> 5) & 1);
              auVar67._20_4_ =
                   (float)((uint)bVar37 * auVar53._20_4_ | (uint)!bVar37 * auVar61._20_4_);
              bVar37 = (bool)((byte)(uVar33 >> 6) & 1);
              auVar67._24_4_ =
                   (float)((uint)bVar37 * auVar53._24_4_ | (uint)!bVar37 * auVar61._24_4_);
              bVar37 = SUB81(uVar33 >> 7,0);
              auVar67._28_4_ = (uint)bVar37 * auVar53._28_4_ | (uint)!bVar37 * auVar61._28_4_;
              bVar37 = (bool)((byte)uVar25 & 1);
              fVar39 = (float)((uint)bVar37 * auVar51._0_4_ | (uint)!bVar37 * auVar54._0_4_);
              bVar37 = (bool)((byte)(uVar25 >> 1) & 1);
              fVar68 = (float)((uint)bVar37 * auVar51._4_4_ | (uint)!bVar37 * auVar54._4_4_);
              bVar37 = (bool)((byte)(uVar25 >> 2) & 1);
              fVar69 = (float)((uint)bVar37 * auVar51._8_4_ | (uint)!bVar37 * auVar54._8_4_);
              bVar37 = (bool)((byte)(uVar25 >> 3) & 1);
              fVar70 = (float)((uint)bVar37 * auVar51._12_4_ | (uint)!bVar37 * auVar54._12_4_);
              bVar37 = (bool)((byte)(uVar25 >> 4) & 1);
              fVar71 = (float)((uint)bVar37 * auVar51._16_4_ | (uint)!bVar37 * auVar54._16_4_);
              bVar37 = (bool)((byte)(uVar25 >> 5) & 1);
              fVar72 = (float)((uint)bVar37 * auVar51._20_4_ | (uint)!bVar37 * auVar54._20_4_);
              bVar37 = (bool)((byte)(uVar25 >> 6) & 1);
              fVar73 = (float)((uint)bVar37 * auVar51._24_4_ | (uint)!bVar37 * auVar54._24_4_);
              bVar37 = SUB81(uVar25 >> 7,0);
              auVar19._4_4_ = fVar81 * fVar68;
              auVar19._0_4_ = fVar81 * fVar39;
              auVar19._8_4_ = fVar81 * fVar69;
              auVar19._12_4_ = fVar81 * fVar70;
              auVar19._16_4_ = fVar81 * fVar71;
              auVar19._20_4_ = fVar81 * fVar72;
              auVar19._24_4_ = fVar81 * fVar73;
              auVar19._28_4_ = fVar81;
              auVar3 = vfmadd213ps_fma(auVar86,auVar67,auVar19);
              auVar3 = vfmadd213ps_fma(auVar79,auVar66,ZEXT1632(auVar3));
              auVar45 = ZEXT1632(CONCAT412(auVar3._12_4_ + auVar3._12_4_,
                                           CONCAT48(auVar3._8_4_ + auVar3._8_4_,
                                                    CONCAT44(auVar3._4_4_ + auVar3._4_4_,
                                                             auVar3._0_4_ + auVar3._0_4_))));
              auVar87._0_4_ = auVar47._0_4_ * fVar39;
              auVar87._4_4_ = auVar47._4_4_ * fVar68;
              auVar87._8_4_ = auVar47._8_4_ * fVar69;
              auVar87._12_4_ = auVar47._12_4_ * fVar70;
              auVar87._16_4_ = auVar47._16_4_ * fVar71;
              auVar87._20_4_ = auVar47._20_4_ * fVar72;
              auVar87._24_4_ = auVar47._24_4_ * fVar73;
              auVar87._28_4_ = 0;
              auVar3 = vfmadd213ps_fma(auVar43,auVar67,auVar87);
              auVar40 = vfmadd213ps_fma(auVar42,auVar66,ZEXT1632(auVar3));
              auVar43 = vrcp14ps_avx512vl(auVar45);
              auVar42._8_4_ = 0x3f800000;
              auVar42._0_8_ = 0x3f8000003f800000;
              auVar42._12_4_ = 0x3f800000;
              auVar42._16_4_ = 0x3f800000;
              auVar42._20_4_ = 0x3f800000;
              auVar42._24_4_ = 0x3f800000;
              auVar42._28_4_ = 0x3f800000;
              auVar42 = vfnmadd213ps_avx512vl(auVar43,auVar45,auVar42);
              auVar3 = vfmadd132ps_fma(auVar42,auVar43,auVar43);
              uVar2 = *(undefined4 *)(local_1660 + local_1680 * 4 + 0x80);
              local_1580._4_4_ = uVar2;
              local_1580._0_4_ = uVar2;
              local_1580._8_4_ = uVar2;
              local_1580._12_4_ = uVar2;
              local_1580._16_4_ = uVar2;
              local_1580._20_4_ = uVar2;
              local_1580._24_4_ = uVar2;
              local_1580._28_4_ = uVar2;
              auVar101 = ZEXT3264(local_1580);
              local_1280 = ZEXT1632(CONCAT412(auVar3._12_4_ * (auVar40._12_4_ + auVar40._12_4_),
                                              CONCAT48(auVar3._8_4_ *
                                                       (auVar40._8_4_ + auVar40._8_4_),
                                                       CONCAT44(auVar3._4_4_ *
                                                                (auVar40._4_4_ + auVar40._4_4_),
                                                                auVar3._0_4_ *
                                                                (auVar40._0_4_ + auVar40._0_4_)))));
              uVar14 = vcmpps_avx512vl(local_1280,local_1580,2);
              uVar2 = *(undefined4 *)(local_1660 + local_1680 * 4 + 0x30);
              auVar17._4_4_ = uVar2;
              auVar17._0_4_ = uVar2;
              auVar17._8_4_ = uVar2;
              auVar17._12_4_ = uVar2;
              auVar17._16_4_ = uVar2;
              auVar17._20_4_ = uVar2;
              auVar17._24_4_ = uVar2;
              auVar17._28_4_ = uVar2;
              uVar15 = vcmpps_avx512vl(local_1280,auVar17,0xd);
              bVar16 = (byte)uVar14 & (byte)uVar15 & bVar16;
              if (bVar16 != 0) {
                local_1678 = vcmpps_avx512vl(auVar45,_DAT_01faff00,4);
                local_1678 = bVar16 & local_1678;
                local_12d8 = (char)local_1678;
                if (local_12d8 != '\0') {
                  local_12e0 = &local_1681;
                  auVar42 = vsubps_avx(local_1300,auVar63);
                  local_1340 = vblendps_avx(auVar62,auVar42,0xf0);
                  auVar42 = vsubps_avx(local_1300,auVar62);
                  local_1320 = vblendps_avx(auVar63,auVar42,0xf0);
                  local_1260[0] = auVar66._0_4_ * 1.0;
                  local_1260[1] = auVar66._4_4_ * 1.0;
                  local_1260[2] = auVar66._8_4_ * 1.0;
                  local_1260[3] = auVar66._12_4_ * 1.0;
                  fStack_1250 = auVar66._16_4_ * -1.0;
                  fStack_124c = auVar66._20_4_ * -1.0;
                  fStack_1248 = auVar66._24_4_ * -1.0;
                  uStack_1244 = auVar66._28_4_;
                  local_1240[0] = auVar67._0_4_ * 1.0;
                  local_1240[1] = auVar67._4_4_ * 1.0;
                  local_1240[2] = auVar67._8_4_ * 1.0;
                  local_1240[3] = auVar67._12_4_ * 1.0;
                  fStack_1230 = auVar67._16_4_ * -1.0;
                  fStack_122c = auVar67._20_4_ * -1.0;
                  fStack_1228 = auVar67._24_4_ * -1.0;
                  uStack_1224 = auVar67._28_4_;
                  local_1220[0] = fVar39 * 1.0;
                  local_1220[1] = fVar68 * 1.0;
                  local_1220[2] = fVar69 * 1.0;
                  local_1220[3] = fVar70 * 1.0;
                  fStack_1210 = fVar71 * -1.0;
                  fStack_120c = fVar72 * -1.0;
                  fStack_1208 = fVar73 * -1.0;
                  uStack_1204 = (uint)bVar37 * auVar51._28_4_ | (uint)!bVar37 * auVar54._28_4_;
                  pGVar29 = (context->scene->geometries).items[*(uint *)(local_15b8 + 0x88)].ptr;
                  if ((pGVar29->mask & *(uint *)(local_1660 + local_1680 * 4 + 0x90)) != 0) {
                    pRVar31 = local_1660;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar29->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_007be4a5:
                      *(undefined4 *)(pRVar31 + local_1680 * 4 + 0x80) = 0xff800000;
                      return bVar38;
                    }
                    auVar42 = vpbroadcastd_avx512vl();
                    auVar42 = vpaddd_avx2(auVar42,_DAT_01fec4a0);
                    auVar43 = vpbroadcastd_avx512vl();
                    auVar43 = vpaddd_avx2(auVar43,_DAT_01fec4c0);
                    auVar77._0_4_ = (float)(int)(*(ushort *)(lVar10 + 8 + lVar30) - 1);
                    auVar77._4_12_ = auVar62._4_12_;
                    auVar12._12_4_ = 0;
                    auVar12._0_12_ = ZEXT812(0);
                    auVar40 = vrcp14ss_avx512f(auVar12 << 0x20,ZEXT416((uint)auVar77._0_4_));
                    auVar3 = vfnmadd213ss_fma(auVar77,auVar40,SUB6416(ZEXT464(0x40000000),0));
                    fVar73 = auVar40._0_4_ * auVar3._0_4_;
                    auVar80._0_4_ = (float)(int)(*(ushort *)(lVar10 + 10 + lVar30) - 1);
                    auVar80._4_12_ = auVar62._4_12_;
                    auVar40 = vrcp14ss_avx512f(auVar12 << 0x20,ZEXT416((uint)auVar80._0_4_));
                    auVar3 = vfnmadd213ss_fma(auVar80,auVar40,SUB6416(ZEXT464(0x40000000),0));
                    fVar85 = auVar40._0_4_ * auVar3._0_4_;
                    auVar42 = vcvtdq2ps_avx(auVar42);
                    auVar43 = vcvtdq2ps_avx(auVar43);
                    auVar18._8_4_ = 0x219392ef;
                    auVar18._0_8_ = 0x219392ef219392ef;
                    auVar18._12_4_ = 0x219392ef;
                    auVar18._16_4_ = 0x219392ef;
                    auVar18._20_4_ = 0x219392ef;
                    auVar18._24_4_ = 0x219392ef;
                    auVar18._28_4_ = 0x219392ef;
                    uVar32 = vcmpps_avx512vl(local_1300,auVar18,5);
                    auVar45 = vrcp14ps_avx512vl(local_1300);
                    auVar78._8_4_ = 0x3f800000;
                    auVar78._0_8_ = 0x3f8000003f800000;
                    auVar78._12_4_ = 0x3f800000;
                    auVar78._16_4_ = 0x3f800000;
                    auVar78._20_4_ = 0x3f800000;
                    auVar78._24_4_ = 0x3f800000;
                    auVar78._28_4_ = 0x3f800000;
                    auVar3 = vfnmadd213ps_fma(local_1300,auVar45,auVar78);
                    auVar46 = vfmadd132ps_avx512vl(ZEXT1632(auVar3),auVar45,auVar45);
                    fVar81 = (float)((uint)((byte)uVar32 & 1) * auVar46._0_4_);
                    fVar39 = (float)((uint)((byte)(uVar32 >> 1) & 1) * auVar46._4_4_);
                    fVar68 = (float)((uint)((byte)(uVar32 >> 2) & 1) * auVar46._8_4_);
                    fVar69 = (float)((uint)((byte)(uVar32 >> 3) & 1) * auVar46._12_4_);
                    fVar70 = (float)((uint)((byte)(uVar32 >> 4) & 1) * auVar46._16_4_);
                    fVar71 = (float)((uint)((byte)(uVar32 >> 5) & 1) * auVar46._20_4_);
                    fVar72 = (float)((uint)((byte)(uVar32 >> 6) & 1) * auVar46._24_4_);
                    auVar20._4_4_ =
                         (local_1300._4_4_ * auVar42._4_4_ + local_1340._4_4_) * fVar73 * fVar39;
                    auVar20._0_4_ =
                         (local_1300._0_4_ * auVar42._0_4_ + local_1340._0_4_) * fVar73 * fVar81;
                    auVar20._8_4_ =
                         (local_1300._8_4_ * auVar42._8_4_ + local_1340._8_4_) * fVar73 * fVar68;
                    auVar20._12_4_ =
                         (local_1300._12_4_ * auVar42._12_4_ + local_1340._12_4_) * fVar73 * fVar69;
                    auVar20._16_4_ =
                         (local_1300._16_4_ * auVar42._16_4_ + local_1340._16_4_) * fVar73 * fVar70;
                    auVar20._20_4_ =
                         (local_1300._20_4_ * auVar42._20_4_ + local_1340._20_4_) * fVar73 * fVar71;
                    auVar20._24_4_ =
                         (local_1300._24_4_ * auVar42._24_4_ + local_1340._24_4_) * fVar73 * fVar72;
                    auVar20._28_4_ = auVar45._28_4_;
                    local_12c0 = vminps_avx(auVar20,auVar78);
                    auVar21._4_4_ =
                         (local_1300._4_4_ * auVar43._4_4_ + local_1320._4_4_) * fVar85 * fVar39;
                    auVar21._0_4_ =
                         (local_1300._0_4_ * auVar43._0_4_ + local_1320._0_4_) * fVar85 * fVar81;
                    auVar21._8_4_ =
                         (local_1300._8_4_ * auVar43._8_4_ + local_1320._8_4_) * fVar85 * fVar68;
                    auVar21._12_4_ =
                         (local_1300._12_4_ * auVar43._12_4_ + local_1320._12_4_) * fVar85 * fVar69;
                    auVar21._16_4_ =
                         (local_1300._16_4_ * auVar43._16_4_ + local_1320._16_4_) * fVar85 * fVar70;
                    auVar21._20_4_ =
                         (local_1300._20_4_ * auVar43._20_4_ + local_1320._20_4_) * fVar85 * fVar71;
                    auVar21._24_4_ =
                         (local_1300._24_4_ * auVar43._24_4_ + local_1320._24_4_) * fVar85 * fVar72;
                    auVar21._28_4_ = (uint)(byte)(uVar32 >> 7) * auVar46._28_4_;
                    local_12a0 = vminps_avx(auVar21,auVar78);
                    local_1668 = 0;
                    for (uVar32 = local_1678; (uVar32 & 1) == 0;
                        uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                      local_1668 = local_1668 + 1;
                    }
                    local_1640 = vpbroadcastd_avx512vl();
                    local_1650 = vpbroadcastd_avx512vl();
                    local_14a0 = auVar108._0_32_;
                    local_14c0 = auVar109._0_32_;
                    local_14e0 = auVar110._0_32_;
                    local_1500 = auVar111._0_32_;
                    local_1520 = auVar112._0_32_;
                    local_1540 = auVar113._0_32_;
                    local_1670 = pGVar29;
                    do {
                      local_1440 = *(undefined4 *)(local_12c0 + local_1668 * 4);
                      local_1430 = *(undefined4 *)(local_12a0 + local_1668 * 4);
                      *(float *)(pRVar31 + local_1680 * 4 + 0x80) = local_1260[local_1668 - 8];
                      local_15b0.context = context->user;
                      local_1470 = local_1260[local_1668];
                      local_1460 = local_1240[local_1668];
                      local_1450 = local_1220[local_1668];
                      local_1420 = local_1650._0_8_;
                      uStack_1418 = local_1650._8_8_;
                      local_1410 = local_1640;
                      vpcmpeqd_avx2(ZEXT1632(local_1640),ZEXT1632(local_1640));
                      uStack_13fc = (local_15b0.context)->instID[0];
                      local_1400 = uStack_13fc;
                      uStack_13f8 = uStack_13fc;
                      uStack_13f4 = uStack_13fc;
                      uStack_13f0 = (local_15b0.context)->instPrimID[0];
                      uStack_13ec = uStack_13f0;
                      uStack_13e8 = uStack_13f0;
                      uStack_13e4 = uStack_13f0;
                      local_1630 = local_1550;
                      local_15b0.valid = (int *)local_1630;
                      local_15b0.geometryUserPtr = pGVar29->userPtr;
                      local_15b0.hit = (RTCHitN *)&local_1470;
                      local_15b0.N = 4;
                      local_15b0.ray = (RTCRayN *)pRVar31;
                      fStack_146c = local_1470;
                      fStack_1468 = local_1470;
                      fStack_1464 = local_1470;
                      fStack_145c = local_1460;
                      fStack_1458 = local_1460;
                      fStack_1454 = local_1460;
                      fStack_144c = local_1450;
                      fStack_1448 = local_1450;
                      fStack_1444 = local_1450;
                      uStack_143c = local_1440;
                      uStack_1438 = local_1440;
                      uStack_1434 = local_1440;
                      uStack_142c = local_1430;
                      uStack_1428 = local_1430;
                      uStack_1424 = local_1430;
                      if (pGVar29->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar29->occlusionFilterN)(&local_15b0);
                        auVar101 = ZEXT3264(local_1580);
                        auVar113 = ZEXT3264(local_1540);
                        auVar112 = ZEXT3264(local_1520);
                        auVar111 = ZEXT3264(local_1500);
                        auVar110 = ZEXT3264(local_14e0);
                        auVar109 = ZEXT3264(local_14c0);
                        auVar108 = ZEXT3264(local_14a0);
                        pGVar29 = local_1670;
                        pRVar31 = local_1660;
                      }
                      uVar32 = vptestmd_avx512vl(local_1630,local_1630);
                      if ((uVar32 & 0xf) != 0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_15b0);
                          auVar101 = ZEXT3264(local_1580);
                          auVar113 = ZEXT3264(local_1540);
                          auVar112 = ZEXT3264(local_1520);
                          auVar111 = ZEXT3264(local_1500);
                          auVar110 = ZEXT3264(local_14e0);
                          auVar109 = ZEXT3264(local_14c0);
                          auVar108 = ZEXT3264(local_14a0);
                          pGVar29 = local_1670;
                          pRVar31 = local_1660;
                        }
                        auVar3 = *(undefined1 (*) [16])(local_15b0.ray + 0x80);
                        uVar32 = vptestmd_avx512vl(local_1630,local_1630);
                        uVar32 = uVar32 & 0xf;
                        auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar37 = (bool)((byte)uVar32 & 1);
                        auVar41._0_4_ = (uint)bVar37 * auVar40._0_4_ | (uint)!bVar37 * auVar3._0_4_;
                        bVar37 = (bool)((byte)(uVar32 >> 1) & 1);
                        auVar41._4_4_ = (uint)bVar37 * auVar40._4_4_ | (uint)!bVar37 * auVar3._4_4_;
                        bVar37 = (bool)((byte)(uVar32 >> 2) & 1);
                        auVar41._8_4_ = (uint)bVar37 * auVar40._8_4_ | (uint)!bVar37 * auVar3._8_4_;
                        bVar37 = SUB81(uVar32 >> 3,0);
                        auVar41._12_4_ =
                             (uint)bVar37 * auVar40._12_4_ | (uint)!bVar37 * auVar3._12_4_;
                        *(undefined1 (*) [16])(local_15b0.ray + 0x80) = auVar41;
                        if ((byte)uVar32 != 0) goto LAB_007be4a5;
                      }
                      *(int *)(pRVar31 + local_1680 * 4 + 0x80) = auVar101._0_4_;
                      uVar32 = local_1668 & 0x3f;
                      local_1668 = 0;
                      local_1678 = local_1678 ^ 1L << uVar32;
                      for (uVar32 = local_1678; (uVar32 & 1) == 0;
                          uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                        local_1668 = local_1668 + 1;
                      }
                    } while (local_1678 != 0);
                  }
                }
              }
            }
            local_15f0 = local_15f0 - 1 & local_15f0;
            auVar101 = ZEXT3264(local_13c0);
            auVar104 = ZEXT3264(local_13e0);
            uVar32 = local_1610;
            uVar33 = local_1618;
            fVar81 = local_1360;
            fVar69 = fStack_135c;
            fVar70 = fStack_1358;
            fVar71 = fStack_1354;
            fVar72 = fStack_1350;
            fVar73 = fStack_134c;
            fVar85 = fStack_1348;
            fVar39 = local_1380;
            fVar88 = fStack_137c;
            fVar89 = fStack_1378;
            fVar90 = fStack_1374;
            fVar91 = fStack_1370;
            fVar92 = fStack_136c;
            fVar93 = fStack_1368;
            fVar68 = local_13a0;
            fVar94 = fStack_139c;
            fVar95 = fStack_1398;
            fVar96 = fStack_1394;
            fVar97 = fStack_1390;
            fVar98 = fStack_138c;
            fVar99 = fStack_1388;
          } while (local_15f0 != 0);
        }
        local_1608 = local_1608 + 1;
      } while (local_1608 != local_1600);
    }
LAB_007be48f:
    bVar38 = local_15f8 != &local_1200;
    if (!bVar38) {
      return bVar38;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }